

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O1

CapabilitySet * __thiscall
spvtools::AssemblyGrammar::filterCapsAgainstTargetEnv
          (CapabilitySet *__return_storage_ptr__,AssemblyGrammar *this,Capability *cap_array,
          uint32_t count)

{
  uint32_t uVar1;
  spv_result_t sVar2;
  ulong uVar3;
  spv_operand_desc entry;
  spv_operand_desc local_58;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  (__return_storage_ptr__->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = spvVersionForTargetEnv(this->target_env_);
  if (count != 0) {
    uVar3 = (ulong)count;
    do {
      local_58 = (spv_operand_desc)0x0;
      sVar2 = spvOperandTableValueLookup
                        (this->target_env_,this->operandTable_,SPV_OPERAND_TYPE_CAPABILITY,
                         *cap_array,&local_58);
      if ((sVar2 == SPV_SUCCESS) &&
         ((((local_58->minVersion <= uVar1 && (uVar1 <= local_58->lastVersion)) ||
           (local_58->numExtensions != 0)) || (local_58->numCapabilities != 0)))) {
        EnumSet<spv::Capability>::insert(&local_50,__return_storage_ptr__,cap_array);
      }
      cap_array = cap_array + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

CapabilitySet AssemblyGrammar::filterCapsAgainstTargetEnv(
    const spv::Capability* cap_array, uint32_t count) const {
  CapabilitySet cap_set;
  const auto version = spvVersionForTargetEnv(target_env_);
  for (uint32_t i = 0; i < count; ++i) {
    spv_operand_desc entry = {};
    if (SPV_SUCCESS == lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                     static_cast<uint32_t>(cap_array[i]),
                                     &entry)) {
      // This token is visible in this environment if it's in an appropriate
      // core version, or it is enabled by a capability or an extension.
      if ((version >= entry->minVersion && version <= entry->lastVersion) ||
          entry->numExtensions > 0u || entry->numCapabilities > 0u) {
        cap_set.insert(cap_array[i]);
      }
    }
  }
  return cap_set;
}